

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

char * upb_MtDecoder_BuildMiniTableExtension
                 (upb_MtDecoder *decoder,char *data,size_t len,upb_MiniTableExtension *ext,
                 upb_MiniTable *extendee,upb_MiniTableSub sub)

{
  byte bVar1;
  upb_MiniTableSub uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t len_00;
  uint16_t count;
  uint16_t local_42;
  upb_MiniTableSub local_40;
  upb_SubCounts local_34;
  
  local_40 = sub;
  iVar3 = __sigsetjmp((decoder->base).err,0);
  uVar2 = local_40;
  if (iVar3 == 0) {
    if ((extendee->ext_dont_copy_me__upb_internal_use_only & 3) == 0) {
      upb_MdDecoder_ErrorJmp(&decoder->base,"Extendee is not extendable");
    }
    if (len == 0) {
      len_00 = 0;
    }
    else {
      if (*data != '#') {
        upb_MdDecoder_ErrorJmp(&decoder->base,"Invalid ext version: %c");
      }
      data = data + 1;
      len_00 = len - 1;
    }
    local_42 = 0;
    local_34.submsg_count = 0;
    local_34.subenum_count = 0;
    pcVar4 = upb_MtDecoder_Parse(decoder,data,len_00,ext,0x20,&local_42,&local_34);
    pcVar5 = (char *)0x0;
    if ((pcVar4 != (char *)0x0) && (local_42 == 1)) {
      bVar1 = (ext->field_dont_copy_me__upb_internal_use_only).
              mode_dont_copy_me__upb_internal_use_only;
      (ext->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only =
           bVar1 | 8;
      (ext->field_dont_copy_me__upb_internal_use_only).offset_dont_copy_me__upb_internal_use_only =
           0;
      (ext->field_dont_copy_me__upb_internal_use_only).presence = 0;
      if (((extendee->ext_dont_copy_me__upb_internal_use_only & 2) == 0) ||
         ((bVar1 & 3) != 1 &&
          ((ext->field_dont_copy_me__upb_internal_use_only).
           descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) == 10)) {
        ext->extendee_dont_copy_me__upb_internal_use_only = extendee;
        ext->sub_dont_copy_me__upb_internal_use_only = uVar2;
        pcVar5 = pcVar4;
      }
      else {
        pcVar5 = (char *)0x0;
      }
    }
  }
  else {
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

static const char* upb_MtDecoder_BuildMiniTableExtension(
    upb_MtDecoder* const decoder, const char* const data, const size_t len,
    upb_MiniTableExtension* const ext, const upb_MiniTable* const extendee,
    const upb_MiniTableSub sub) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableExtension(decoder, data, len, ext,
                                                 extendee, sub);
}